

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase581::run(TestCase581 *this)

{
  long lVar1;
  PromiseArena *pPVar2;
  _func_int *p_Var3;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  OwnPromiseNode OVar4;
  AsyncOutputStream AVar5;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar6;
  int iVar7;
  void *pvVar8;
  SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:613:13)>
  *location_03;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:616:11)>
  *location_04;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:603:11)>
  *location_05;
  PromiseBase PVar9;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:601:13)>
  *location_06;
  OwnPromiseNode intermediate_2;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:616:11),_unsigned_long>
  promise2;
  AsyncOutputStream local_170;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_168;
  PromiseBase local_160;
  OwnFd sokcetServer;
  OwnFd socketClient;
  String result2;
  Fault f;
  bool local_118;
  AsyncInputStream local_110;
  OwnPromiseNode intermediate_3;
  String result;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receivedStream;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:605:11),_unsigned_long>
  promise;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  int socketFds [2];
  Own<kj::AsyncIoStream,_std::nullptr_t> clientStream;
  CapabilityPipe pipe2;
  AsyncIoContext io;
  
  setupAsyncIo();
  socketFds[0] = 0;
  socketFds[1] = 0;
  do {
    iVar7 = socketpair(1,1,0,socketFds);
    if (-1 < iVar7) goto LAB_001eebc5;
    iVar7 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar7 == -1);
  if (iVar7 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x24d,iVar7,"socketpair(AF_UNIX, SOCK_STREAM, 0, socketFds)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001eebc5:
  socketClient.fd = socketFds[0];
  sokcetServer.fd = socketFds[1];
  newCapabilityPipe();
  receiveBuffer1[0] = '\0';
  receiveBuffer1[1] = '\0';
  receiveBuffer1[2] = '\0';
  receiveBuffer1[3] = '\0';
  receiveBuffer2[0] = '\0';
  receiveBuffer2[1] = '\0';
  receiveBuffer2[2] = '\0';
  receiveBuffer2[3] = '\0';
  LowLevelAsyncIoProvider::wrapSocketFd
            ((LowLevelAsyncIoProvider *)&clientStream,(OwnFd *)io.lowLevelProvider.ptr,
             (uint)&socketClient);
  AsyncCapabilityStream::sendFd((AsyncCapabilityStream *)&promise2,(int)pipe2.ends[0].ptr);
  result.content.ptr =
       (char *)kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:601:13)>
               ::anon_class_8_1_cb284929_for_func::operator();
  lVar1 = *(long *)((long)promise2.super_PromiseBase.node.ptr + 8);
  local_170._vptr_AsyncOutputStream = (_func_int **)&clientStream;
  if (lVar1 == 0 || (ulong)((long)promise2.super_PromiseBase.node.ptr - lVar1) < 0x28) {
    pvVar8 = operator_new(0x400);
    location_06 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:601:13)>
                   *)((long)pvVar8 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase581::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__1,void*&>
              (location_06,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise2,
               (anon_class_8_1_cb284929_for_func *)&local_170,(void **)&result);
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    *(undefined8 *)((long)promise2.super_PromiseBase.node.ptr + 8) = 0;
    location_06 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:601:13)>
                   *)((long)promise2.super_PromiseBase.node.ptr + -0x28);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase581::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__1,void*&>
              (location_06,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise2,
               (anon_class_8_1_cb284929_for_func *)&local_170,(void **)&result);
    *(long *)((long)promise2.super_PromiseBase.node.ptr + -0x20) = lVar1;
  }
  f.exception = (Exception *)&DAT_003d3151;
  location.function = &DAT_003d31b0;
  location.fileName = &DAT_003d3151;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  result2.content.ptr = (char *)location_06;
  kj::_::maybeChain<void>(&intermediate_2,(Promise<void> *)&result2,location);
  OVar4 = intermediate_2;
  intermediate_2.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_2);
  local_160.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar4.ptr;
  receivedStream.disposer = (Disposer *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&receivedStream);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&result2);
  PVar9.node.ptr = local_160.node.ptr;
  result2.content.ptr =
       (char *)kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:603:11)>
               ::anon_class_16_2_320fd09c_for_func::operator();
  pPVar2 = *(PromiseArena **)((long)local_160.node.ptr + 8);
  result.content.ptr = (char *)&clientStream;
  result.content.size_ = (size_t)receiveBuffer1;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_160.node.ptr - (long)pPVar2) < 0x30) {
    pvVar8 = operator_new(0x400);
    location_05 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:603:11)>
                   *)((long)pvVar8 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase581::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__2,void*&>
              (location_05,&local_160.node,(anon_class_16_2_320fd09c_for_func *)&result,
               (void **)&result2);
    *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
  }
  else {
    *(PromiseArena **)((long)local_160.node.ptr + 8) = (PromiseArena *)0x0;
    location_05 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:603:11)>
                   *)((long)local_160.node.ptr + -0x30);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase581::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__2,void*&>
              (location_05,&local_160.node,(anon_class_16_2_320fd09c_for_func *)&result,
               (void **)&result2);
    (((PromiseNode *)((long)PVar9.node.ptr + -0x30))->super_PromiseArenaMember).arena = pPVar2;
  }
  f.exception = (Exception *)&DAT_003d3151;
  location_00.function = &DAT_003d31b0;
  location_00.fileName = &DAT_003d3151;
  location_00.lineNumber = 0x58b;
  location_00.columnNumber = 0x4c;
  receivedStream.disposer = (Disposer *)location_05;
  kj::_::maybeChain<unsigned_long>
            (&intermediate_3,(Promise<unsigned_long> *)&receivedStream,location_00);
  OVar4 = intermediate_3;
  intermediate_3.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  local_168.ptr = OVar4.ptr;
  intermediate_2.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&receivedStream);
  OVar6.ptr = local_168.ptr;
  f.exception = (Exception *)
                kj::_::
                SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:605:11)>
                ::anon_class_8_1_8ba005cc_for_func::operator();
  pPVar2 = ((local_168.ptr)->super_PromiseArenaMember).arena;
  intermediate_2.ptr = (PromiseNode *)receiveBuffer1;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_168.ptr - (long)pPVar2) < 0x28) {
    pvVar8 = operator_new(0x400);
    PVar9.node.ptr = (OwnPromiseNode)((long)pvVar8 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase581::run()::__3>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__3,void*&>
              ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:605:11)>
                *)PVar9.node.ptr,&local_168,(anon_class_8_1_8ba005cc_for_func *)&intermediate_2,
               &f.exception);
    *(void **)((long)pvVar8 + 0x3e0) = pvVar8;
  }
  else {
    ((local_168.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    PVar9.node.ptr = (OwnPromiseNode)&local_168.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase581::run()::__3>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__3,void*&>
              ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:605:11)>
                *)PVar9.node.ptr,&local_168,(anon_class_8_1_8ba005cc_for_func *)&intermediate_2,
               &f.exception);
    OVar6.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  result2.content.ptr = (char *)0x0;
  receivedStream.disposer = (Disposer *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar9.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&receivedStream);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&result2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_168);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_160.node);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise2);
  receivedStream.disposer = (Disposer *)0x0;
  receivedStream.ptr = (AsyncCapabilityStream *)0x0;
  AsyncCapabilityStream::receiveFd((AsyncCapabilityStream *)&stack0xfffffffffffffef0);
  result.content.size_ = (size_t)&io;
  result2.content.ptr =
       (char *)kj::_::
               SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:613:13)>
               ::anon_class_24_3_98c709d1_for_func::operator();
  p_Var3 = local_110._vptr_AsyncInputStream[1];
  result.content.ptr = (char *)&receivedStream;
  result.content.disposer = (ArrayDisposer *)receiveBuffer2;
  if (p_Var3 == (_func_int *)0x0 ||
      (ulong)((long)local_110._vptr_AsyncInputStream - (long)p_Var3) < 0x38) {
    pvVar8 = operator_new(0x400);
    location_03 = (SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:613:13)>
                   *)((long)pvVar8 + 0x3c8);
    ctor<kj::_::SimpleTransformPromiseNode<kj::OwnFd,kj::(anonymous_namespace)::TestCase581::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__4,void*&>
              (location_03,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffef0,
               (anon_class_24_3_98c709d1_for_func *)&result,(void **)&result2);
    *(void **)((long)pvVar8 + 0x3d0) = pvVar8;
  }
  else {
    local_110._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    location_03 = (SimpleTransformPromiseNode<kj::OwnFd,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:613:13)>
                   *)(local_110._vptr_AsyncInputStream + -7);
    ctor<kj::_::SimpleTransformPromiseNode<kj::OwnFd,kj::(anonymous_namespace)::TestCase581::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__4,void*&>
              (location_03,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffef0,
               (anon_class_24_3_98c709d1_for_func *)&result,(void **)&result2);
    local_110._vptr_AsyncInputStream[-6] = p_Var3;
  }
  f.exception = (Exception *)&DAT_003d3151;
  location_01.function = &DAT_003d31b0;
  location_01.fileName = &DAT_003d3151;
  location_01.lineNumber = 0x58b;
  location_01.columnNumber = 0x4c;
  intermediate_2.ptr = (PromiseNode *)location_03;
  kj::_::maybeChain<unsigned_long>(&local_168,(Promise<unsigned_long> *)&intermediate_2,location_01)
  ;
  OVar6.ptr = local_168.ptr;
  local_168.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_168);
  local_170._vptr_AsyncOutputStream = (_func_int **)OVar6.ptr;
  intermediate_3.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_2);
  AVar5._vptr_AsyncOutputStream = local_170._vptr_AsyncOutputStream;
  intermediate_2.ptr =
       (PromiseNode *)
       kj::_::
       SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:616:11)>
       ::anon_class_16_2_5e707987_for_func::operator();
  pPVar2 = (PromiseArena *)local_170._vptr_AsyncOutputStream[1];
  result2.content.ptr = (char *)&receivedStream;
  result2.content.size_ = (size_t)receiveBuffer2;
  if (pPVar2 == (PromiseArena *)0x0 ||
      (ulong)((long)local_170._vptr_AsyncOutputStream - (long)pPVar2) < 0x30) {
    pvVar8 = operator_new(0x400);
    location_04 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:616:11)>
                   *)((long)pvVar8 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase581::run()::__5>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__5,void*&>
              (location_04,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170,
               (anon_class_16_2_5e707987_for_func *)&result2,&intermediate_2.ptr);
    *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
  }
  else {
    local_170._vptr_AsyncOutputStream[1] = (_func_int *)0x0;
    location_04 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:616:11)>
                   *)(local_170._vptr_AsyncOutputStream + -6);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase581::run()::__5>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase581::run()::__5,void*&>
              (location_04,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170,
               (anon_class_16_2_5e707987_for_func *)&result2,&intermediate_2.ptr);
    AVar5._vptr_AsyncOutputStream[-5] = (_func_int *)pPVar2;
  }
  f.exception = (Exception *)&DAT_003d3151;
  location_02.function = &DAT_003d31b0;
  location_02.fileName = &DAT_003d3151;
  location_02.lineNumber = 0x58b;
  location_02.columnNumber = 0x4c;
  intermediate_3.ptr = (PromiseNode *)location_04;
  kj::_::maybeChain<kj::String>(&local_160.node,(Promise<kj::String> *)&intermediate_3,location_02);
  PVar9.node.ptr = local_160.node.ptr;
  local_160.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_160.node);
  promise2.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar9.node.ptr;
  local_168.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_168);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffef0);
  Promise<kj::String>::wait((Promise<kj::String> *)&result,&promise);
  Promise<kj::String>::wait((Promise<kj::String> *)&result2,&promise2);
  intermediate_2.ptr = (PromiseNode *)0x401abd;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)&f,
             (DebugExpression<char_const(&)[4]> *)&intermediate_2,&result);
  if ((local_118 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x272,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (result)\", _kjCondition, \"bar\", result",
               (char (*) [37])"failed: expected (\"bar\") == (result)",
               (DebugComparison<const_char_(&)[4],_kj::String_&> *)&f,(char (*) [4])0x401abd,&result
              );
  }
  intermediate_2.ptr = (PromiseNode *)0x423c58;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)&f,
             (DebugExpression<char_const(&)[4]> *)&intermediate_2,&result2);
  if ((local_118 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x273,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result2)\", _kjCondition, \"foo\", result2"
               ,(char (*) [38])"failed: expected (\"foo\") == (result2)",
               (DebugComparison<const_char_(&)[4],_kj::String_&> *)&f,(char (*) [4])0x423c58,
               &result2);
  }
  Array<char>::~Array(&result2.content);
  Array<char>::~Array(&result.content);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise2);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(&receivedStream);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&clientStream);
  CapabilityPipe::~CapabilityPipe(&pipe2);
  OwnFd::~OwnFd(&sokcetServer);
  OwnFd::~OwnFd(&socketClient);
  AsyncIoContext::~AsyncIoContext(&io);
  return;
}

Assistant:

TEST(AsyncIo, InMemoryCapabilityPipeFdsReverse) {
  // Same as above, except we do sendFd() first, then receiveFd(). This hits `BlockedWrite` instead
  // of `BlockedRead`. At one time there was a bug in that code that mishandled the file
  // descriptors.

  auto io = setupAsyncIo();

  int socketFds[2]{};
  KJ_SYSCALL(socketpair(AF_UNIX, SOCK_STREAM, 0, socketFds));
  kj::OwnFd socketClient(socketFds[0]);
  kj::OwnFd sokcetServer(socketFds[1]);

  auto pipe2 = newCapabilityPipe();
  char receiveBuffer1[4]{};
  char receiveBuffer2[4]{};

  // Send an FD, then write "foo" to the other end of the sent stream, then receive "bar"
  // from it.
  auto clientStream = io.lowLevelProvider->wrapSocketFd(kj::mv(socketClient));
  auto promise = pipe2.ends[0]->sendFd(kj::mv(sokcetServer))
      .then([&]() {
    return clientStream->write("foo"_kjb);
  }).then([&]() {
    return clientStream->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  });

  // Expect to receive an FD, then read "foo" from it, then write "bar" to it.
  Own<AsyncCapabilityStream> receivedStream;
  auto promise2 = pipe2.ends[1]->receiveFd()
      .then([&](OwnFd fd) {
    receivedStream = io.lowLevelProvider->wrapUnixSocketFd(kj::mv(fd));
    return receivedStream->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return receivedStream->write("bar"_kjb).then([&receiveBuffer2,n]() {
      return heapString(receiveBuffer2, n);
    });
  });

  kj::String result = promise.wait(io.waitScope);
  kj::String result2 = promise2.wait(io.waitScope);

  EXPECT_EQ("bar", result);
  EXPECT_EQ("foo", result2);
}